

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void write_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                        int blk_col,aom_writer *w)

{
  BLOCK_SIZE BVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FRAME_CONTEXT *pFVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  TX_SIZE TVar15;
  ulong uVar16;
  byte *__s;
  int col;
  int iVar17;
  aom_cdf_prob (*paaVar18) [3];
  ulong uVar19;
  
  BVar1 = mbmi->bsize;
  bVar12 = block_size_high[BVar1];
  uVar13 = (uint)bVar12;
  if (xd->mb_to_bottom_edge < 0) {
    uVar13 = (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f)) +
             (uint)bVar12;
  }
  bVar11 = block_size_wide[BVar1];
  uVar14 = (uint)bVar11;
  if (xd->mb_to_right_edge < 0) {
    uVar14 = (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f)) + (uint)bVar11
    ;
  }
  if ((int)uVar13 >> 2 <= blk_row) {
    return;
  }
  if ((int)uVar14 >> 2 <= blk_col) {
    return;
  }
  __s = xd->above_txfm_context + blk_col;
  if (depth == 2) {
    bVar12 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[tx_size]];
    uVar13 = tx_size_wide[tx_size];
    memset(xd->left_txfm_context + blk_row,tx_size_high[tx_size],
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[tx_size]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[tx_size]] == 0) & 0xff));
    uVar14 = (uint)bVar12 + (uint)(bVar12 == 0);
    goto LAB_009fcc07;
  }
  uVar19 = (ulong)tx_size;
  uVar13 = (uint)*(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  uVar14 = (uint)*(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  if (tx_size == '\0') {
    lVar10 = 0;
  }
  else {
    uVar8 = (uint)bVar12;
    if (bVar12 < bVar11) {
      uVar8 = (uint)bVar11;
    }
    bVar12 = 1;
    bVar11 = 1;
    uVar16 = 0x3f;
    if (uVar8 < 0x20) {
      if (uVar8 == 8) {
        TVar15 = '\x01';
        bVar12 = 0;
      }
      else {
        if (uVar8 != 0x10) goto LAB_009fcaf9;
        TVar15 = '\x02';
        bVar12 = bVar11;
      }
LAB_009fcad2:
      uVar16 = (ulong)(byte)(((""[uVar19] != TVar15 & bVar12) + TVar15 * -2) * '\x03' + 0x18);
    }
    else {
      TVar15 = '\x04';
      if ((uVar8 == 0x80) || (TVar15 = '\x04', bVar12 = bVar11, uVar8 == 0x40)) goto LAB_009fcad2;
      if (uVar8 == 0x20) {
        TVar15 = '\x03';
        goto LAB_009fcad2;
      }
    }
LAB_009fcaf9:
    lVar10 = (ulong)(xd->left_txfm_context[blk_row] < uVar14) + (ulong)(*__s < uVar13) + uVar16;
  }
  pFVar7 = xd->tile_ctx;
  if (mbmi->inter_tx_size
      [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
       ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
       (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))] == tx_size) {
    paaVar18 = pFVar7->txfm_partition_cdf + lVar10;
    od_ec_encode_cdf_q15(&w->ec,0,*paaVar18,2);
    if (w->allow_update_cdf != '\0') {
      uVar2 = pFVar7->txfm_partition_cdf[lVar10][2];
      (*paaVar18)[0] = (*paaVar18)[0] - ((*paaVar18)[0] >> ((char)(uVar2 >> 4) + 4U & 0x1f));
      pFVar7->txfm_partition_cdf[lVar10][2] = uVar2 + (uVar2 < 0x20);
    }
    __s = xd->above_txfm_context + blk_col;
    bVar12 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar19]];
    memset(xd->left_txfm_context + blk_row,uVar14,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar19]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar19]] == 0) & 0xff));
    uVar14 = (uint)bVar12 + (uint)(bVar12 == 0);
  }
  else {
    bVar12 = ""[uVar19];
    iVar3 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar12 * 4));
    iVar4 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar12 * 4));
    paaVar18 = pFVar7->txfm_partition_cdf + lVar10;
    od_ec_encode_cdf_q15(&w->ec,1,*paaVar18,2);
    if (w->allow_update_cdf != '\0') {
      uVar2 = (*paaVar18)[2];
      (*paaVar18)[0] =
           (short)((int)(0x8000 - (uint)(*paaVar18)[0]) >> ((char)(uVar2 >> 4) + 4U & 0x1f)) +
           (*paaVar18)[0];
      (*paaVar18)[2] = uVar2 + (uVar2 < 0x20);
    }
    if ((99UL >> (uVar19 & 0x3f) & 1) == 0) {
      iVar5 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      iVar6 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      iVar9 = 0;
      do {
        iVar17 = 0;
        do {
          write_tx_size_vartx(xd,mbmi,bVar12,depth + 1,iVar9 + blk_row,blk_col + iVar17,w);
          iVar17 = iVar17 + iVar3;
        } while (iVar17 < iVar6);
        iVar9 = iVar9 + iVar4;
      } while (iVar9 < iVar5);
      return;
    }
    __s = xd->above_txfm_context + blk_col;
    bVar11 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar19]];
    uVar13 = tx_size_wide[bVar12];
    memset(xd->left_txfm_context + blk_row,tx_size_high[bVar12],
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar19]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar19]] == 0) & 0xff));
    uVar14 = (uint)bVar11 + (uint)(bVar11 == 0);
  }
LAB_009fcc07:
  memset(__s,uVar13,(ulong)(uVar14 & 0xff));
  return;
}

Assistant:

static inline void write_tx_size_vartx(MACROBLOCKD *xd,
                                       const MB_MODE_INFO *mbmi,
                                       TX_SIZE tx_size, int depth, int blk_row,
                                       int blk_col, aom_writer *w) {
  FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
  const int max_blocks_high = max_block_high(xd, mbmi->bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, mbmi->bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (depth == MAX_VARTX_DEPTH) {
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  const int txb_size_index =
      av1_get_txb_size_index(mbmi->bsize, blk_row, blk_col);
  const int write_txfm_partition =
      tx_size == mbmi->inter_tx_size[txb_size_index];
  if (write_txfm_partition) {
    aom_write_symbol(w, 0, ec_ctx->txfm_partition_cdf[ctx], 2);

    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    // TODO(yuec): set correct txfm partition update for qttx
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    aom_write_symbol(w, 1, ec_ctx->txfm_partition_cdf[ctx], 2);

    if (sub_txs == TX_4X4) {
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        const int offsetc = blk_col + col;
        write_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, w);
      }
    }
  }
}